

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contains.hpp
# Opt level: O2

bool linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
               (ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *source,int *item)

{
  int iVar1;
  long lVar2;
  
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Init(source);
  while( true ) {
    lVar2 = 0x18;
    if (source->s1 == false) {
      iVar1 = (*((source->source2).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IState[1])();
      if ((char)iVar1 == '\0') {
        return false;
      }
      if ((source->s1 & 1U) == 0) {
        lVar2 = 0x30;
      }
    }
    iVar1 = (**(code **)(**(long **)((long)&(source->super_IState<int>)._vptr_IState + lVar2) + 0x18
                        ))();
    if (iVar1 == *item) break;
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(source);
  }
  return true;
}

Assistant:

bool Contains(S&& source, const T& item)
	{
		for(source.Init() ; source.Valid() ; source.Advance())
			if(source.Current() == item)
				return true;

		return false;
	}